

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasExtensionFromFile
               (Message *msg,FileDescriptor *file,Options *options,bool *has_opt_codesize_extension)

{
  byte bVar1;
  FieldDescriptor *this;
  bool bVar2;
  FileOptions_OptimizeMode FVar3;
  int iVar4;
  Descriptor *pDVar5;
  Message *pMVar6;
  Nonnull<const_char_*> failure_msg;
  int iVar7;
  int index;
  Reflection *this_00;
  pointer ppFVar8;
  pointer ppFVar9;
  bool bVar10;
  Metadata MVar11;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_68;
  pointer local_48;
  LogMessageFatal local_40;
  
  local_68.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MVar11 = Message::GetMetadata(msg);
  this_00 = MVar11.reflection;
  Reflection::ListFields(this_00,msg,&local_68);
  bVar10 = local_68.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_68.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar10) {
    local_48 = local_68.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppFVar8 = local_68.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppFVar9 = local_68.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this = *ppFVar9;
      pDVar5 = FieldDescriptor::message_type(this);
      if (pDVar5 == (Descriptor *)0x0) {
        iVar7 = 3;
      }
      else {
        if ((this->field_0x1 & 8) != 0) {
          pDVar5 = FieldDescriptor::message_type(this);
          if (pDVar5->file_ == file) {
            iVar7 = 1;
            goto LAB_00dc8c9d;
          }
          if ((has_opt_codesize_extension != (bool *)0x0) &&
             (FVar3 = GetOptimizeFor(pDVar5->file_,options,(bool *)0x0),
             FVar3 == FileOptions_OptimizeMode_CODE_SIZE)) {
            *has_opt_codesize_extension = true;
          }
        }
        bVar1 = this->field_0x1;
        bVar2 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar2) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar2,0xbf < bVar1,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
        }
        if ((this->field_0x1 & 0x20) == 0) {
          pMVar6 = Reflection::GetMessage(this_00,msg,this,(MessageFactory *)0x0);
          bVar2 = HasExtensionFromFile(pMVar6,file,options,has_opt_codesize_extension);
          iVar7 = 1;
          if (!bVar2) {
LAB_00dc8c94:
            iVar7 = 0;
          }
        }
        else {
          iVar7 = 0;
          do {
            index = iVar7;
            iVar4 = Reflection::FieldSize(this_00,msg,this);
            if (iVar4 <= index) {
              iVar7 = 4;
              goto LAB_00dc8c86;
            }
            pMVar6 = Reflection::GetRepeatedMessage(this_00,msg,this,index);
            bVar2 = HasExtensionFromFile(pMVar6,file,options,has_opt_codesize_extension);
            iVar7 = index + 1;
          } while (!bVar2);
          iVar7 = 1;
LAB_00dc8c86:
          ppFVar8 = local_48;
          if (iVar4 <= index) goto LAB_00dc8c94;
        }
      }
LAB_00dc8c9d:
      if ((iVar7 != 3) && (iVar7 != 0)) break;
      ppFVar9 = ppFVar9 + 1;
      bVar10 = ppFVar9 != ppFVar8;
    } while (bVar10);
  }
  if (local_68.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar10;
}

Assistant:

static bool HasExtensionFromFile(const Message& msg, const FileDescriptor* file,
                                 const Options& options,
                                 bool* has_opt_codesize_extension) {
  std::vector<const FieldDescriptor*> fields;
  auto reflection = msg.GetReflection();
  reflection->ListFields(msg, &fields);
  for (auto field : fields) {
    const auto* field_msg = field->message_type();
    if (field_msg == nullptr) {
      // It so happens that enums Is_Valid are still generated so enums work.
      // Only messages have potential problems.
      continue;
    }
    // If this option has an extension set AND that extension is defined in the
    // same file we have bootstrap problem.
    if (field->is_extension()) {
      const auto* msg_extension_file = field->message_type()->file();
      if (msg_extension_file == file) return true;
      if (has_opt_codesize_extension &&
          GetOptimizeFor(msg_extension_file, options) ==
              FileOptions::CODE_SIZE) {
        *has_opt_codesize_extension = true;
      }
    }
    // Recurse in this field to see if there is a problem in there
    if (field->is_repeated()) {
      for (int i = 0; i < reflection->FieldSize(msg, field); i++) {
        if (HasExtensionFromFile(reflection->GetRepeatedMessage(msg, field, i),
                                 file, options, has_opt_codesize_extension)) {
          return true;
        }
      }
    } else {
      if (HasExtensionFromFile(reflection->GetMessage(msg, field), file,
                               options, has_opt_codesize_extension)) {
        return true;
      }
    }
  }
  return false;
}